

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void Lib::
     OutputAll<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_unsigned_int,_const_char_*>
     ::apply(ostream *out,char *m,
            basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ms,char *ms_1,
            uint ms_2,char *ms_3)

{
  pointer pcVar1;
  size_t sVar2;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  if (m == (char *)0x0) {
    std::ios::clear((int)out + (int)*(undefined8 *)(*(long *)out + -0x18));
  }
  else {
    sVar2 = strlen(m);
    std::__ostream_insert<char,std::char_traits<char>>(out,m,sVar2);
  }
  pcVar1 = (ms->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + ms->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_50,local_48);
  OutputAll<const_char_*,_unsigned_int,_const_char_*>::apply(out,ms_1,ms_2,ms_3);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return;
}

Assistant:

static void apply(std::ostream& out, M m, Ms... ms) {
    out << m;
    OutputAll<Ms...>::apply(out, ms...);
  }